

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirit2_playground.cpp
# Opt level: O3

void __thiscall
client::
mini_xml_grammar<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
::mini_xml_grammar(mini_xml_grammar<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *this)

{
  rule<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_client::mini_xml_(),_boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<boost::spirit::tag::char_code<boost::spirit::tag::space,_boost::spirit::char_encoding::ascii>_>,_0L>,_boost::spirit::unused_type,_boost::spirit::unused_type>
  *prVar1;
  string *psVar2;
  rule<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(),_boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<boost::spirit::tag::char_code<boost::spirit::tag::space,_boost::spirit::char_encoding::ascii>_>,_0L>,_boost::spirit::unused_type,_boost::spirit::unused_type>
  *prVar3;
  car_type when_print;
  car_type switch_to_print;
  car_type transitions_from_print;
  expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<boost::spirit::terminal_ex<boost::spirit::tag::lit,_boost::fusion::vector<const_char_(&)[17]>_>_>,_0L>
  that;
  expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<boost::spirit::terminal_ex<boost::spirit::tag::lit,_boost::fusion::vector<const_char_(&)[10]>_>_>,_0L>
  that_1;
  expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<boost::spirit::terminal_ex<boost::spirit::tag::lit,_boost::fusion::vector<char>_>_>,_0L>
  that_3;
  action<boost::spirit::qi::difference<boost::spirit::qi::char_class<boost::spirit::tag::char_code<boost::spirit::tag::char_,_boost::spirit::char_encoding::ascii>_>,_boost::spirit::qi::literal_char<boost::spirit::char_encoding::standard,_true,_false>_>,_boost::phoenix::actor<boost::proto::exprns_::basic_expr<boost::proto::tagns_::tag::plus_assign,_boost::proto::argsns_::list2<boost::phoenix::actor<boost::spirit::attribute<0>_>,_boost::phoenix::actor<boost::spirit::argument<0>_>_>,_2L>_>_>
  in_stack_fffffffffffffe98;
  char local_15b [2];
  char local_159;
  undefined1 local_158 [11];
  car_type cStack_14d;
  undefined4 uStack_14c;
  expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<boost::spirit::qi::reference<const_boost::spirit::qi::rule<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_boost::variant<boost::recursive_wrapper<client::mini_xml>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_(),_boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<boost::spirit::tag::char_code<boost::spirit::tag::space,_boost::spirit::char_encoding::ascii>_>,_0L>,_boost::spirit::unused_type,_boost::spirit::unused_type>_>_>,_0L>
  local_148;
  reference_wrapper<const_boost::spirit::qi::rule<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>),_boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<boost::spirit::tag::char_code<boost::spirit::tag::space,_boost::spirit::char_encoding::ascii>_>,_0L>,_boost::spirit::unused_type,_boost::spirit::unused_type>_>
  local_138;
  undefined1 local_120 [24];
  undefined1 local_108 [24];
  function_buffer *local_f0;
  undefined1 local_e8 [16];
  function_buffer *local_d8;
  char *local_d0;
  rule<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(),_boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<boost::spirit::tag::char_code<boost::spirit::tag::space,_boost::spirit::char_encoding::ascii>_>,_0L>,_boost::spirit::unused_type,_boost::spirit::unused_type>
  *local_c8;
  function_buffer *local_c0;
  function_buffer local_b8;
  rule<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(),_boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<boost::spirit::tag::char_code<boost::spirit::tag::space,_boost::spirit::char_encoding::ascii>_>,_0L>,_boost::spirit::unused_type,_boost::spirit::unused_type>
  *local_a0;
  rule<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(),_boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<boost::spirit::tag::char_code<boost::spirit::tag::space,_boost::spirit::char_encoding::ascii>_>,_0L>,_boost::spirit::unused_type,_boost::spirit::unused_type>
  *local_98;
  undefined1 local_90 [32];
  rule<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>),_boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<boost::spirit::tag::char_code<boost::spirit::tag::space,_boost::spirit::char_encoding::ascii>_>,_0L>,_boost::spirit::unused_type,_boost::spirit::unused_type>
  *local_70;
  rule<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(),_boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<boost::spirit::tag::char_code<boost::spirit::tag::space,_boost::spirit::char_encoding::ascii>_>,_0L>,_boost::spirit::unused_type,_boost::spirit::unused_type>
  *local_68;
  rule<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_boost::variant<boost::recursive_wrapper<client::mini_xml>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_(),_boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<boost::spirit::tag::char_code<boost::spirit::tag::space,_boost::spirit::char_encoding::ascii>_>,_0L>,_boost::spirit::unused_type,_boost::spirit::unused_type>
  *local_60;
  rule<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(),_boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<boost::spirit::tag::char_code<boost::spirit::tag::space,_boost::spirit::char_encoding::ascii>_>,_0L>,_boost::spirit::unused_type,_boost::spirit::unused_type>
  *local_58;
  rule<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_client::mini_xml_(),_boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<boost::spirit::tag::char_code<boost::spirit::tag::space,_boost::spirit::char_encoding::ascii>_>,_0L>,_boost::spirit::unused_type,_boost::spirit::unused_type>
  *local_50;
  string *local_48;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  **local_40;
  undefined1 *local_38;
  
  local_158._0_8_ =
       (rule<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_client::mini_xml_(),_boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<boost::spirit::tag::char_code<boost::spirit::tag::space,_boost::spirit::char_encoding::ascii>_>,_0L>,_boost::spirit::unused_type,_boost::spirit::unused_type>
        *)&local_148;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_158,"unnamed-grammar","");
  prVar1 = &this->xml;
  (this->
  super_grammar<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_client::mini_xml_(),_boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<boost::spirit::tag::char_code<boost::spirit::tag::space,_boost::spirit::char_encoding::ascii>_>,_0L>,_boost::spirit::unused_type,_boost::spirit::unused_type>
  ).
  super_extends<boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<boost::spirit::qi::reference<const_boost::spirit::qi::rule<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_client::mini_xml_(),_boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<boost::spirit::tag::char_code<boost::spirit::tag::space,_boost::spirit::char_encoding::ascii>_>,_0L>,_boost::spirit::unused_type,_boost::spirit::unused_type>_>_>,_0L>,_boost::spirit::qi::grammar<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_client::mini_xml_(),_boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<boost::spirit::tag::char_code<boost::spirit::tag::space,_boost::spirit::char_encoding::ascii>_>,_0L>,_boost::spirit::unused_type,_boost::spirit::unused_type>,_boost::proto::domainns_::default_domain,_0L>
  .proto_expr_.child0.ref.t_ = prVar1;
  psVar2 = &(this->
            super_grammar<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_client::mini_xml_(),_boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<boost::spirit::tag::char_code<boost::spirit::tag::space,_boost::spirit::char_encoding::ascii>_>,_0L>,_boost::spirit::unused_type,_boost::spirit::unused_type>
            ).name_;
  local_90._16_8_ =
       &(this->
        super_grammar<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_client::mini_xml_(),_boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<boost::spirit::tag::char_code<boost::spirit::tag::space,_boost::spirit::char_encoding::ascii>_>,_0L>,_boost::spirit::unused_type,_boost::spirit::unused_type>
        ).name_.field_2;
  (this->
  super_grammar<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_client::mini_xml_(),_boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<boost::spirit::tag::char_code<boost::spirit::tag::space,_boost::spirit::char_encoding::ascii>_>,_0L>,_boost::spirit::unused_type,_boost::spirit::unused_type>
  ).name_._M_dataplus._M_p = (pointer)local_90._16_8_;
  std::__cxx11::string::_M_construct<char*>
            ((string *)psVar2,local_158._0_8_,(long)stack0xfffffffffffffeb0 + local_158._0_8_);
  if ((rule<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_client::mini_xml_(),_boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<boost::spirit::tag::char_code<boost::spirit::tag::space,_boost::spirit::char_encoding::ascii>_>,_0L>,_boost::spirit::unused_type,_boost::spirit::unused_type>
       *)local_158._0_8_ !=
      (rule<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_client::mini_xml_(),_boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<boost::spirit::tag::char_code<boost::spirit::tag::space,_boost::spirit::char_encoding::ascii>_>,_0L>,_boost::spirit::unused_type,_boost::spirit::unused_type>
       *)&local_148) {
    operator_delete((void *)local_158._0_8_,(ulong)((long)local_148.child0.ref.t_ + 1));
  }
  local_158._0_8_ =
       (rule<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_client::mini_xml_(),_boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<boost::spirit::tag::char_code<boost::spirit::tag::space,_boost::spirit::char_encoding::ascii>_>,_0L>,_boost::spirit::unused_type,_boost::spirit::unused_type>
        *)&local_148;
  local_48 = psVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_158,"unnamed-rule","");
  (this->xml).
  super_extends<boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<boost::spirit::qi::reference<const_boost::spirit::qi::rule<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_client::mini_xml_(),_boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<boost::spirit::tag::char_code<boost::spirit::tag::space,_boost::spirit::char_encoding::ascii>_>,_0L>,_boost::spirit::unused_type,_boost::spirit::unused_type>_>_>,_0L>,_boost::spirit::qi::rule<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_client::mini_xml_(),_boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<boost::spirit::tag::char_code<boost::spirit::tag::space,_boost::spirit::char_encoding::ascii>_>,_0L>,_boost::spirit::unused_type,_boost::spirit::unused_type>,_boost::proto::domainns_::default_domain,_0L>
  .proto_expr_.child0.ref.t_ = prVar1;
  (this->xml).name_._M_dataplus._M_p = (pointer)&(this->xml).name_.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&(this->xml).name_,local_158._0_8_,
             (long)stack0xfffffffffffffeb0 + local_158._0_8_);
  (this->xml).f.
  super_function4<bool,___gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_&,_const___gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_&,_boost::spirit::context<boost::fusion::cons<client::mini_xml_&,_boost::fusion::nil_>,_boost::fusion::vector<>_>_&,_const_boost::spirit::qi::char_class<boost::spirit::tag::char_code<boost::spirit::tag::space,_boost::spirit::char_encoding::ascii>_>_&>
  .super_function_base.vtable = (vtable_base *)0x0;
  if ((rule<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_client::mini_xml_(),_boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<boost::spirit::tag::char_code<boost::spirit::tag::space,_boost::spirit::char_encoding::ascii>_>,_0L>,_boost::spirit::unused_type,_boost::spirit::unused_type>
       *)local_158._0_8_ !=
      (rule<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_client::mini_xml_(),_boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<boost::spirit::tag::char_code<boost::spirit::tag::space,_boost::spirit::char_encoding::ascii>_>,_0L>,_boost::spirit::unused_type,_boost::spirit::unused_type>
       *)&local_148) {
    operator_delete((void *)local_158._0_8_,(ulong)((long)local_148.child0.ref.t_ + 1));
  }
  local_158._0_8_ =
       (rule<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_client::mini_xml_(),_boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<boost::spirit::tag::char_code<boost::spirit::tag::space,_boost::spirit::char_encoding::ascii>_>,_0L>,_boost::spirit::unused_type,_boost::spirit::unused_type>
        *)&local_148;
  local_50 = prVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_158,"unnamed-rule","");
  (this->node).
  super_extends<boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<boost::spirit::qi::reference<const_boost::spirit::qi::rule<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_boost::variant<boost::recursive_wrapper<client::mini_xml>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_(),_boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<boost::spirit::tag::char_code<boost::spirit::tag::space,_boost::spirit::char_encoding::ascii>_>,_0L>,_boost::spirit::unused_type,_boost::spirit::unused_type>_>_>,_0L>,_boost::spirit::qi::rule<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_boost::variant<boost::recursive_wrapper<client::mini_xml>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_(),_boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<boost::spirit::tag::char_code<boost::spirit::tag::space,_boost::spirit::char_encoding::ascii>_>,_0L>,_boost::spirit::unused_type,_boost::spirit::unused_type>,_boost::proto::domainns_::default_domain,_0L>
  .proto_expr_.child0.ref.t_ = &this->node;
  (this->node).name_._M_dataplus._M_p = (pointer)&(this->node).name_.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&(this->node).name_,local_158._0_8_,
             (long)stack0xfffffffffffffeb0 + local_158._0_8_);
  (this->node).f.
  super_function4<bool,___gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_&,_const___gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_&,_boost::spirit::context<boost::fusion::cons<boost::variant<boost::recursive_wrapper<client::mini_xml>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_&,_boost::fusion::nil_>,_boost::fusion::vector<>_>_&,_const_boost::spirit::qi::char_class<boost::spirit::tag::char_code<boost::spirit::tag::space,_boost::spirit::char_encoding::ascii>_>_&>
  .super_function_base.vtable = (vtable_base *)0x0;
  if ((rule<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_client::mini_xml_(),_boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<boost::spirit::tag::char_code<boost::spirit::tag::space,_boost::spirit::char_encoding::ascii>_>,_0L>,_boost::spirit::unused_type,_boost::spirit::unused_type>
       *)local_158._0_8_ !=
      (rule<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_client::mini_xml_(),_boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<boost::spirit::tag::char_code<boost::spirit::tag::space,_boost::spirit::char_encoding::ascii>_>,_0L>,_boost::spirit::unused_type,_boost::spirit::unused_type>
       *)&local_148) {
    operator_delete((void *)local_158._0_8_,(ulong)((long)local_148.child0.ref.t_ + 1));
  }
  local_158._0_8_ =
       (rule<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_client::mini_xml_(),_boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<boost::spirit::tag::char_code<boost::spirit::tag::space,_boost::spirit::char_encoding::ascii>_>,_0L>,_boost::spirit::unused_type,_boost::spirit::unused_type>
        *)&local_148;
  local_60 = &this->node;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_158,"unnamed-rule","");
  prVar3 = &this->text;
  (this->text).
  super_extends<boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<boost::spirit::qi::reference<const_boost::spirit::qi::rule<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(),_boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<boost::spirit::tag::char_code<boost::spirit::tag::space,_boost::spirit::char_encoding::ascii>_>,_0L>,_boost::spirit::unused_type,_boost::spirit::unused_type>_>_>,_0L>,_boost::spirit::qi::rule<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(),_boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<boost::spirit::tag::char_code<boost::spirit::tag::space,_boost::spirit::char_encoding::ascii>_>,_0L>,_boost::spirit::unused_type,_boost::spirit::unused_type>,_boost::proto::domainns_::default_domain,_0L>
  .proto_expr_.child0.ref.t_ = prVar3;
  (this->text).name_._M_dataplus._M_p = (pointer)&(this->text).name_.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&(this->text).name_,local_158._0_8_,
             (long)stack0xfffffffffffffeb0 + local_158._0_8_);
  (this->text).f.
  super_function4<bool,___gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_&,_const___gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_&,_boost::spirit::context<boost::fusion::cons<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_boost::fusion::nil_>,_boost::fusion::vector<>_>_&,_const_boost::spirit::qi::char_class<boost::spirit::tag::char_code<boost::spirit::tag::space,_boost::spirit::char_encoding::ascii>_>_&>
  .super_function_base.vtable = (vtable_base *)0x0;
  if ((rule<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_client::mini_xml_(),_boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<boost::spirit::tag::char_code<boost::spirit::tag::space,_boost::spirit::char_encoding::ascii>_>,_0L>,_boost::spirit::unused_type,_boost::spirit::unused_type>
       *)local_158._0_8_ !=
      (rule<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_client::mini_xml_(),_boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<boost::spirit::tag::char_code<boost::spirit::tag::space,_boost::spirit::char_encoding::ascii>_>,_0L>,_boost::spirit::unused_type,_boost::spirit::unused_type>
       *)&local_148) {
    operator_delete((void *)local_158._0_8_,(ulong)((long)local_148.child0.ref.t_ + 1));
  }
  local_158._0_8_ =
       (rule<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_client::mini_xml_(),_boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<boost::spirit::tag::char_code<boost::spirit::tag::space,_boost::spirit::char_encoding::ascii>_>,_0L>,_boost::spirit::unused_type,_boost::spirit::unused_type>
        *)&local_148;
  local_58 = prVar3;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_158,"unnamed-rule","");
  local_68 = &this->start_tag;
  (this->start_tag).
  super_extends<boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<boost::spirit::qi::reference<const_boost::spirit::qi::rule<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(),_boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<boost::spirit::tag::char_code<boost::spirit::tag::space,_boost::spirit::char_encoding::ascii>_>,_0L>,_boost::spirit::unused_type,_boost::spirit::unused_type>_>_>,_0L>,_boost::spirit::qi::rule<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(),_boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<boost::spirit::tag::char_code<boost::spirit::tag::space,_boost::spirit::char_encoding::ascii>_>,_0L>,_boost::spirit::unused_type,_boost::spirit::unused_type>,_boost::proto::domainns_::default_domain,_0L>
  .proto_expr_.child0.ref.t_ = local_68;
  (this->start_tag).name_._M_dataplus._M_p = (pointer)&(this->start_tag).name_.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&(this->start_tag).name_,local_158._0_8_,
             (long)stack0xfffffffffffffeb0 + local_158._0_8_);
  (this->start_tag).f.
  super_function4<bool,___gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_&,_const___gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_&,_boost::spirit::context<boost::fusion::cons<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_boost::fusion::nil_>,_boost::fusion::vector<>_>_&,_const_boost::spirit::qi::char_class<boost::spirit::tag::char_code<boost::spirit::tag::space,_boost::spirit::char_encoding::ascii>_>_&>
  .super_function_base.vtable = (vtable_base *)0x0;
  if ((rule<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_client::mini_xml_(),_boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<boost::spirit::tag::char_code<boost::spirit::tag::space,_boost::spirit::char_encoding::ascii>_>,_0L>,_boost::spirit::unused_type,_boost::spirit::unused_type>
       *)local_158._0_8_ !=
      (rule<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_client::mini_xml_(),_boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<boost::spirit::tag::char_code<boost::spirit::tag::space,_boost::spirit::char_encoding::ascii>_>,_0L>,_boost::spirit::unused_type,_boost::spirit::unused_type>
       *)&local_148) {
    operator_delete((void *)local_158._0_8_,(ulong)((long)local_148.child0.ref.t_ + 1));
  }
  local_158._0_8_ =
       (rule<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_client::mini_xml_(),_boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<boost::spirit::tag::char_code<boost::spirit::tag::space,_boost::spirit::char_encoding::ascii>_>,_0L>,_boost::spirit::unused_type,_boost::spirit::unused_type>
        *)&local_148;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_158,"unnamed-rule","");
  local_70 = &this->end_tag;
  (this->end_tag).
  super_extends<boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<boost::spirit::qi::reference<const_boost::spirit::qi::rule<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>),_boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<boost::spirit::tag::char_code<boost::spirit::tag::space,_boost::spirit::char_encoding::ascii>_>,_0L>,_boost::spirit::unused_type,_boost::spirit::unused_type>_>_>,_0L>,_boost::spirit::qi::rule<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>),_boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<boost::spirit::tag::char_code<boost::spirit::tag::space,_boost::spirit::char_encoding::ascii>_>,_0L>,_boost::spirit::unused_type,_boost::spirit::unused_type>,_boost::proto::domainns_::default_domain,_0L>
  .proto_expr_.child0.ref.t_ = local_70;
  (this->end_tag).name_._M_dataplus._M_p = (pointer)&(this->end_tag).name_.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&(this->end_tag).name_,local_158._0_8_,
             (long)stack0xfffffffffffffeb0 + local_158._0_8_);
  (this->end_tag).f.
  super_function4<bool,___gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_&,_const___gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_&,_boost::spirit::context<boost::fusion::cons<boost::spirit::unused_type_&,_boost::fusion::cons<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::fusion::nil_>_>,_boost::fusion::vector<>_>_&,_const_boost::spirit::qi::char_class<boost::spirit::tag::char_code<boost::spirit::tag::space,_boost::spirit::char_encoding::ascii>_>_&>
  .super_function_base.vtable = (vtable_base *)0x0;
  if ((rule<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_client::mini_xml_(),_boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<boost::spirit::tag::char_code<boost::spirit::tag::space,_boost::spirit::char_encoding::ascii>_>,_0L>,_boost::spirit::unused_type,_boost::spirit::unused_type>
       *)local_158._0_8_ !=
      (rule<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_client::mini_xml_(),_boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<boost::spirit::tag::char_code<boost::spirit::tag::space,_boost::spirit::char_encoding::ascii>_>,_0L>,_boost::spirit::unused_type,_boost::spirit::unused_type>
       *)&local_148) {
    operator_delete((void *)local_158._0_8_,(ulong)((long)local_148.child0.ref.t_ + 1));
  }
  local_158._0_8_ =
       (rule<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_client::mini_xml_(),_boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<boost::spirit::tag::char_code<boost::spirit::tag::space,_boost::spirit::char_encoding::ascii>_>,_0L>,_boost::spirit::unused_type,_boost::spirit::unused_type>
        *)&local_148;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_158,"unnamed-rule","");
  local_90._24_8_ = &this->transitions_declaration;
  (this->transitions_declaration).
  super_extends<boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<boost::spirit::qi::reference<const_boost::spirit::qi::rule<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(),_boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<boost::spirit::tag::char_code<boost::spirit::tag::space,_boost::spirit::char_encoding::ascii>_>,_0L>,_boost::spirit::unused_type,_boost::spirit::unused_type>_>_>,_0L>,_boost::spirit::qi::rule<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(),_boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<boost::spirit::tag::char_code<boost::spirit::tag::space,_boost::spirit::char_encoding::ascii>_>,_0L>,_boost::spirit::unused_type,_boost::spirit::unused_type>,_boost::proto::domainns_::default_domain,_0L>
  .proto_expr_.child0.ref.t_ =
       (rule<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(),_boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<boost::spirit::tag::char_code<boost::spirit::tag::space,_boost::spirit::char_encoding::ascii>_>,_0L>,_boost::spirit::unused_type,_boost::spirit::unused_type>
        *)local_90._24_8_;
  (this->transitions_declaration).name_._M_dataplus._M_p =
       (pointer)&(this->transitions_declaration).name_.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&(this->transitions_declaration).name_,local_158._0_8_,
             (long)stack0xfffffffffffffeb0 + local_158._0_8_);
  (this->transitions_declaration).f.
  super_function4<bool,___gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_&,_const___gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_&,_boost::spirit::context<boost::fusion::cons<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_boost::fusion::nil_>,_boost::fusion::vector<>_>_&,_const_boost::spirit::qi::char_class<boost::spirit::tag::char_code<boost::spirit::tag::space,_boost::spirit::char_encoding::ascii>_>_&>
  .super_function_base.vtable = (vtable_base *)0x0;
  if ((rule<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_client::mini_xml_(),_boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<boost::spirit::tag::char_code<boost::spirit::tag::space,_boost::spirit::char_encoding::ascii>_>,_0L>,_boost::spirit::unused_type,_boost::spirit::unused_type>
       *)local_158._0_8_ !=
      (rule<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_client::mini_xml_(),_boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<boost::spirit::tag::char_code<boost::spirit::tag::space,_boost::spirit::char_encoding::ascii>_>,_0L>,_boost::spirit::unused_type,_boost::spirit::unused_type>
       *)&local_148) {
    operator_delete((void *)local_158._0_8_,(ulong)((long)local_148.child0.ref.t_ + 1));
  }
  local_158._0_8_ =
       (rule<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_client::mini_xml_(),_boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<boost::spirit::tag::char_code<boost::spirit::tag::space,_boost::spirit::char_encoding::ascii>_>,_0L>,_boost::spirit::unused_type,_boost::spirit::unused_type>
        *)&local_148;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_158,"unnamed-rule","");
  local_98 = &this->transitions_from;
  (this->transitions_from).
  super_extends<boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<boost::spirit::qi::reference<const_boost::spirit::qi::rule<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(),_boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<boost::spirit::tag::char_code<boost::spirit::tag::space,_boost::spirit::char_encoding::ascii>_>,_0L>,_boost::spirit::unused_type,_boost::spirit::unused_type>_>_>,_0L>,_boost::spirit::qi::rule<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(),_boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<boost::spirit::tag::char_code<boost::spirit::tag::space,_boost::spirit::char_encoding::ascii>_>,_0L>,_boost::spirit::unused_type,_boost::spirit::unused_type>,_boost::proto::domainns_::default_domain,_0L>
  .proto_expr_.child0.ref.t_ = local_98;
  (this->transitions_from).name_._M_dataplus._M_p = (pointer)&(this->transitions_from).name_.field_2
  ;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&(this->transitions_from).name_,local_158._0_8_,
             (long)stack0xfffffffffffffeb0 + local_158._0_8_);
  (this->transitions_from).f.
  super_function4<bool,___gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_&,_const___gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_&,_boost::spirit::context<boost::fusion::cons<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_boost::fusion::nil_>,_boost::fusion::vector<>_>_&,_const_boost::spirit::qi::char_class<boost::spirit::tag::char_code<boost::spirit::tag::space,_boost::spirit::char_encoding::ascii>_>_&>
  .super_function_base.vtable = (vtable_base *)0x0;
  if ((rule<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_client::mini_xml_(),_boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<boost::spirit::tag::char_code<boost::spirit::tag::space,_boost::spirit::char_encoding::ascii>_>,_0L>,_boost::spirit::unused_type,_boost::spirit::unused_type>
       *)local_158._0_8_ !=
      (rule<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_client::mini_xml_(),_boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<boost::spirit::tag::char_code<boost::spirit::tag::space,_boost::spirit::char_encoding::ascii>_>,_0L>,_boost::spirit::unused_type,_boost::spirit::unused_type>
       *)&local_148) {
    operator_delete((void *)local_158._0_8_,(ulong)((long)local_148.child0.ref.t_ + 1));
  }
  local_158._0_8_ =
       (rule<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_client::mini_xml_(),_boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<boost::spirit::tag::char_code<boost::spirit::tag::space,_boost::spirit::char_encoding::ascii>_>,_0L>,_boost::spirit::unused_type,_boost::spirit::unused_type>
        *)&local_148;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_158,"unnamed-rule","");
  local_a0 = &this->switch_to;
  (this->switch_to).
  super_extends<boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<boost::spirit::qi::reference<const_boost::spirit::qi::rule<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(),_boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<boost::spirit::tag::char_code<boost::spirit::tag::space,_boost::spirit::char_encoding::ascii>_>,_0L>,_boost::spirit::unused_type,_boost::spirit::unused_type>_>_>,_0L>,_boost::spirit::qi::rule<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(),_boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<boost::spirit::tag::char_code<boost::spirit::tag::space,_boost::spirit::char_encoding::ascii>_>,_0L>,_boost::spirit::unused_type,_boost::spirit::unused_type>,_boost::proto::domainns_::default_domain,_0L>
  .proto_expr_.child0.ref.t_ = local_a0;
  (this->switch_to).name_._M_dataplus._M_p = (pointer)&(this->switch_to).name_.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&(this->switch_to).name_,local_158._0_8_,
             (long)stack0xfffffffffffffeb0 + local_158._0_8_);
  (this->switch_to).f.
  super_function4<bool,___gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_&,_const___gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_&,_boost::spirit::context<boost::fusion::cons<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_boost::fusion::nil_>,_boost::fusion::vector<>_>_&,_const_boost::spirit::qi::char_class<boost::spirit::tag::char_code<boost::spirit::tag::space,_boost::spirit::char_encoding::ascii>_>_&>
  .super_function_base.vtable = (vtable_base *)0x0;
  if ((rule<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_client::mini_xml_(),_boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<boost::spirit::tag::char_code<boost::spirit::tag::space,_boost::spirit::char_encoding::ascii>_>,_0L>,_boost::spirit::unused_type,_boost::spirit::unused_type>
       *)local_158._0_8_ !=
      (rule<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_client::mini_xml_(),_boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<boost::spirit::tag::char_code<boost::spirit::tag::space,_boost::spirit::char_encoding::ascii>_>,_0L>,_boost::spirit::unused_type,_boost::spirit::unused_type>
       *)&local_148) {
    operator_delete((void *)local_158._0_8_,(ulong)((long)local_148.child0.ref.t_ + 1));
  }
  local_158._0_8_ =
       (rule<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_client::mini_xml_(),_boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<boost::spirit::tag::char_code<boost::spirit::tag::space,_boost::spirit::char_encoding::ascii>_>,_0L>,_boost::spirit::unused_type,_boost::spirit::unused_type>
        *)&local_148;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_158,"unnamed-rule","");
  local_b8._16_8_ = &this->when;
  (this->when).
  super_extends<boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<boost::spirit::qi::reference<const_boost::spirit::qi::rule<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(),_boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<boost::spirit::tag::char_code<boost::spirit::tag::space,_boost::spirit::char_encoding::ascii>_>,_0L>,_boost::spirit::unused_type,_boost::spirit::unused_type>_>_>,_0L>,_boost::spirit::qi::rule<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(),_boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<boost::spirit::tag::char_code<boost::spirit::tag::space,_boost::spirit::char_encoding::ascii>_>,_0L>,_boost::spirit::unused_type,_boost::spirit::unused_type>,_boost::proto::domainns_::default_domain,_0L>
  .proto_expr_.child0.ref.t_ =
       (rule<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(),_boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<boost::spirit::tag::char_code<boost::spirit::tag::space,_boost::spirit::char_encoding::ascii>_>,_0L>,_boost::spirit::unused_type,_boost::spirit::unused_type>
        *)local_b8._16_8_;
  (this->when).name_._M_dataplus._M_p = (pointer)&(this->when).name_.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&(this->when).name_,local_158._0_8_,
             (long)stack0xfffffffffffffeb0 + local_158._0_8_);
  (this->when).f.
  super_function4<bool,___gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_&,_const___gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_&,_boost::spirit::context<boost::fusion::cons<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_boost::fusion::nil_>,_boost::fusion::vector<>_>_&,_const_boost::spirit::qi::char_class<boost::spirit::tag::char_code<boost::spirit::tag::space,_boost::spirit::char_encoding::ascii>_>_&>
  .super_function_base.vtable = (vtable_base *)0x0;
  if ((rule<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_client::mini_xml_(),_boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<boost::spirit::tag::char_code<boost::spirit::tag::space,_boost::spirit::char_encoding::ascii>_>,_0L>,_boost::spirit::unused_type,_boost::spirit::unused_type>
       *)local_158._0_8_ !=
      (rule<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_client::mini_xml_(),_boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<boost::spirit::tag::char_code<boost::spirit::tag::space,_boost::spirit::char_encoding::ascii>_>,_0L>,_boost::spirit::unused_type,_boost::spirit::unused_type>
       *)&local_148) {
    operator_delete((void *)local_158._0_8_,(ulong)((long)local_148.child0.ref.t_ + 1));
  }
  boost::
  function<bool(__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>&,__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>const&,boost::spirit::context<boost::fusion::cons<std::__cxx11::string&,boost::fusion::nil_>,boost::fusion::vector<>>&,boost::spirit::qi::char_class<boost::spirit::tag::char_code<boost::spirit::tag::space,boost::spirit::char_encoding::ascii>>const&)>
  ::operator=((function<bool(__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>&,__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>const&,boost::spirit::context<boost::fusion::cons<std::__cxx11::string&,boost::fusion::nil_>,boost::fusion::vector<>>&,boost::spirit::qi::char_class<boost::spirit::tag::char_code<boost::spirit::tag::space,boost::spirit::char_encoding::ascii>>const&)>
               *)&(this->text).f,
              (parser_binder<boost::spirit::qi::lexeme_directive<boost::spirit::qi::plus<boost::spirit::qi::action<boost::spirit::qi::difference<boost::spirit::qi::char_class<boost::spirit::tag::char_code<boost::spirit::tag::char_,_boost::spirit::char_encoding::ascii>_>,_boost::spirit::qi::literal_char<boost::spirit::char_encoding::standard,_true,_false>_>,_boost::phoenix::actor<boost::proto::exprns_::basic_expr<boost::proto::tagns_::tag::plus_assign,_boost::proto::argsns_::list2<boost::phoenix::actor<boost::spirit::attribute<0>_>,_boost::phoenix::actor<boost::spirit::argument<0>_>_>,_2L>_>_>_>_>,_mpl_::bool_<false>_>
               )in_stack_fffffffffffffe98);
  unique0x00012000 =
       (reference_wrapper<const_boost::spirit::qi::rule<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(),_boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<boost::spirit::tag::char_code<boost::spirit::tag::space,_boost::spirit::char_encoding::ascii>_>,_0L>,_boost::spirit::unused_type,_boost::spirit::unused_type>_>
        )(prVar3->
         super_extends<boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<boost::spirit::qi::reference<const_boost::spirit::qi::rule<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(),_boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<boost::spirit::tag::char_code<boost::spirit::tag::space,_boost::spirit::char_encoding::ascii>_>,_0L>,_boost::spirit::unused_type,_boost::spirit::unused_type>_>_>,_0L>,_boost::spirit::qi::rule<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(),_boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<boost::spirit::tag::char_code<boost::spirit::tag::space,_boost::spirit::char_encoding::ascii>_>,_0L>,_boost::spirit::unused_type,_boost::spirit::unused_type>,_boost::proto::domainns_::default_domain,_0L>
         ).proto_expr_.child0.ref.t_;
  local_158._0_8_ =
       (prVar1->
       super_extends<boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<boost::spirit::qi::reference<const_boost::spirit::qi::rule<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_client::mini_xml_(),_boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<boost::spirit::tag::char_code<boost::spirit::tag::space,_boost::spirit::char_encoding::ascii>_>,_0L>,_boost::spirit::unused_type,_boost::spirit::unused_type>_>_>,_0L>,_boost::spirit::qi::rule<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_client::mini_xml_(),_boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<boost::spirit::tag::char_code<boost::spirit::tag::space,_boost::spirit::char_encoding::ascii>_>,_0L>,_boost::spirit::unused_type,_boost::spirit::unused_type>,_boost::proto::domainns_::default_domain,_0L>
       ).proto_expr_.child0.ref.t_;
  boost::
  function<bool(__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>&,__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>const&,boost::spirit::context<boost::fusion::cons<boost::variant<boost::recursive_wrapper<client::mini_xml>,std::__cxx11::string>&,boost::fusion::nil_>,boost::fusion::vector<>>&,boost::spirit::qi::char_class<boost::spirit::tag::char_code<boost::spirit::tag::space,boost::spirit::char_encoding::ascii>>const&)>
  ::operator=((function<bool(__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>&,__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>const&,boost::spirit::context<boost::fusion::cons<boost::variant<boost::recursive_wrapper<client::mini_xml>,std::__cxx11::string>&,boost::fusion::nil_>,boost::fusion::vector<>>&,boost::spirit::qi::char_class<boost::spirit::tag::char_code<boost::spirit::tag::space,boost::spirit::char_encoding::ascii>>const&)>
               *)&(this->node).f,
              (parser_binder<boost::spirit::qi::action<boost::spirit::qi::alternative<boost::fusion::cons<boost::spirit::qi::reference<const_boost::spirit::qi::rule<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_client::mini_xml_(),_boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<boost::spirit::tag::char_code<boost::spirit::tag::space,_boost::spirit::char_encoding::ascii>_>,_0L>,_boost::spirit::unused_type,_boost::spirit::unused_type>_>,_boost::fusion::cons<boost::spirit::qi::reference<const_boost::spirit::qi::rule<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(),_boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<boost::spirit::tag::char_code<boost::spirit::tag::space,_boost::spirit::char_encoding::ascii>_>,_0L>,_boost::spirit::unused_type,_boost::spirit::unused_type>_>,_boost::fusion::nil_>_>_>,_boost::phoenix::actor<boost::proto::exprns_::basic_expr<boost::proto::tagns_::tag::assign,_boost::proto::argsns_::list2<boost::phoenix::actor<boost::spirit::attribute<0>_>,_boost::phoenix::actor<boost::spirit::argument<0>_>_>,_2L>_>_>,_mpl_::bool_<false>_>
               *)local_158);
  local_108._8_8_ = &local_159;
  local_159 = 't';
  local_120._16_8_ = local_108;
  local_108._0_8_ = &boost::spirit::ascii::char_;
  local_90._0_8_ = (long)local_120 + 0x10;
  local_90._8_8_ = local_e8;
  local_e8._0_8_ = "transitions_from";
  local_c0 = (function_buffer *)(local_120 + 0xc);
  local_120[0xc] = 0x28;
  local_38 = local_120 + 0xb;
  local_120[0xb] = 0x29;
  local_40 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
              **)&boost::spirit::ascii::char_;
  local_120._0_8_ = &local_d8;
  local_d0 = local_15b;
  local_b8._8_8_ = local_120;
  local_158._0_8_ = local_108 + 0x10;
  unique0x10000e34 =
       (reference_wrapper<const_boost::spirit::qi::rule<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(),_boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<boost::spirit::tag::char_code<boost::spirit::tag::space,_boost::spirit::char_encoding::ascii>_>,_0L>,_boost::spirit::unused_type,_boost::spirit::unused_type>_>
        )(local_120 + 10);
  local_120[10] = 0x29;
  local_b8.members.obj_ptr = &boost::spirit::lexeme;
  local_108._16_8_ = &local_c8;
  local_f0 = &local_b8;
  local_d8 = (function_buffer *)&local_40;
  local_c8 = (rule<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(),_boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<boost::spirit::tag::char_code<boost::spirit::tag::space,_boost::spirit::char_encoding::ascii>_>,_0L>,_boost::spirit::unused_type,_boost::spirit::unused_type>
              *)local_90;
  boost::spirit::qi::
  rule<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>,std::__cxx11::string(),boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,boost::proto::argsns_::term<boost::spirit::tag::char_code<boost::spirit::tag::space,boost::spirit::char_encoding::ascii>>,0l>,boost::spirit::unused_type,boost::spirit::unused_type>
  ::
  define<mpl_::bool_<false>,boost::proto::exprns_::expr<boost::proto::tagns_::tag::shift_right,boost::proto::argsns_::list2<boost::proto::exprns_::expr<boost::proto::tagns_::tag::shift_right,boost::proto::argsns_::list2<boost::proto::exprns_::expr<boost::proto::tagns_::tag::shift_right,boost::proto::argsns_::list2<boost::proto::exprns_::expr<boost::proto::tagns_::tag::shift_right,boost::proto::argsns_::list2<boost::proto::exprns_::expr<boost::proto::tagns_::tag::dereference,boost::proto::argsns_::list1<boost::proto::exprns_::expr<boost::proto::tagns_::tag::minus,boost::proto::argsns_::list2<boost::spirit::terminal<boost::spirit::tag::char_code<boost::spirit::tag::char_,boost::spirit::char_encoding::ascii>>const&,boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,boost::proto::argsns_::term<char_const&>,0l>>,2l>const&>,1l>const&,boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,boost::proto::argsns_::term<boost::spirit::terminal_ex<boost::spirit::tag::lit,boost:___exprns_::expr<boost::proto::tagns_::tag::terminal,boost::proto::argsns_::term<char_const&>,0l>>,2l>>
            (local_98);
  local_90._0_8_ = "switch_to";
  local_120[0x10] = '(';
  local_c0 = (function_buffer *)((long)local_120 + 0x10);
  local_120[0] = 0x29;
  local_b8.members.obj_ptr = &boost::spirit::ascii::char_;
  local_b8._8_8_ = local_120;
  local_d8 = (function_buffer *)local_e8;
  local_108._0_8_ = &boost::spirit::lexeme;
  local_108._8_8_ = &local_d8;
  local_f0 = (function_buffer *)local_108;
  local_15b[0] = ')';
  local_158._0_8_ = local_108 + 0x10;
  unique0x100011cc =
       (reference_wrapper<const_boost::spirit::qi::rule<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(),_boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<boost::spirit::tag::char_code<boost::spirit::tag::space,_boost::spirit::char_encoding::ascii>_>,_0L>,_boost::spirit::unused_type,_boost::spirit::unused_type>_>
        )(reference_wrapper<const_boost::spirit::qi::rule<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(),_boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<boost::spirit::tag::char_code<boost::spirit::tag::space,_boost::spirit::char_encoding::ascii>_>,_0L>,_boost::spirit::unused_type,_boost::spirit::unused_type>_>
          )local_15b;
  local_108._16_8_ = &local_c8;
  local_e8._0_8_ = &local_b8;
  local_e8._8_8_ = (function_buffer *)&local_40;
  local_c8 = (rule<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(),_boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<boost::spirit::tag::char_code<boost::spirit::tag::space,_boost::spirit::char_encoding::ascii>_>,_0L>,_boost::spirit::unused_type,_boost::spirit::unused_type>
              *)local_90;
  boost::spirit::qi::
  rule<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>,std::__cxx11::string(),boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,boost::proto::argsns_::term<boost::spirit::tag::char_code<boost::spirit::tag::space,boost::spirit::char_encoding::ascii>>,0l>,boost::spirit::unused_type,boost::spirit::unused_type>
  ::
  define<mpl_::bool_<false>,boost::proto::exprns_::expr<boost::proto::tagns_::tag::shift_right,boost::proto::argsns_::list2<boost::proto::exprns_::expr<boost::proto::tagns_::tag::shift_right,boost::proto::argsns_::list2<boost::proto::exprns_::expr<boost::proto::tagns_::tag::shift_right,boost::proto::argsns_::list2<boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,boost::proto::argsns_::term<boost::spirit::terminal_ex<boost::spirit::tag::lit,boost::fusion::vector<char_const(&)[10]>>>,0l>const&,boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,boost::proto::argsns_::term<char_const&>,0l>>,2l>const&,boost::proto::exprns_::expr<boost::proto::tagns_::tag::subscript,boost::proto::argsns_::list2<boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,boost::proto::argsns_::term<boost::spirit::tag::lexeme>,0l>const&,boost::proto::exprns_::expr<boost::proto::tagns_::tag::unary_plus,boost::proto::argsns_::list1<boost::proto::exprns_::expr<boost::proto::tagns_::tag::subscript,boost::proto::argsns_::list2<boost::proto::exprns_::expr<boost::proto::tagns_::tag::minus,boost::proto::argsns_::list2<boost::spirit::terminal<boost::spirit::tag::char_code<boost::spirit::tag::char_,boost::spirit::char_encoding::ascii>>const&,boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,boost::proto::argsns_::term<char_const&>,0l>>,2l>const&,boost::phoenix::actor<boost::proto::exprns_::basic_expr<boost::proto::tagns_::tag::plus_assign,boost::proto::argsns_::list2<boost::phoenix::actor<boost::spirit::attribute<0>>,boost::phoenix::actor<boost::spirit::argument<0>>>,2l>>const&>,2l>const&>,1l>const&>,2l>const&>,2l>const&,boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,boost::proto::argsns_::term<char_const&>,0l>>,2l>>
            (local_a0);
  local_90._0_8_ = "when";
  local_120[0x10] = '(';
  local_c0 = (function_buffer *)((long)local_120 + 0x10);
  local_120[0] = 0x29;
  local_b8.members.obj_ptr = &boost::spirit::ascii::char_;
  local_b8._8_8_ = local_120;
  local_108._0_8_ = &boost::spirit::lexeme;
  local_108._8_8_ = &local_d8;
  local_15b[0] = ')';
  local_158._0_8_ = local_108 + 0x10;
  unique0x100011d4 =
       (reference_wrapper<const_boost::spirit::qi::rule<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(),_boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<boost::spirit::tag::char_code<boost::spirit::tag::space,_boost::spirit::char_encoding::ascii>_>,_0L>,_boost::spirit::unused_type,_boost::spirit::unused_type>_>
        )(rule<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(),_boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<boost::spirit::tag::char_code<boost::spirit::tag::space,_boost::spirit::char_encoding::ascii>_>,_0L>,_boost::spirit::unused_type,_boost::spirit::unused_type>
          *)local_15b;
  local_108._16_8_ = &local_c8;
  local_f0 = (function_buffer *)local_108;
  local_e8._0_8_ = &local_b8;
  local_e8._8_8_ = (function_buffer *)&local_40;
  local_d8 = (function_buffer *)local_e8;
  local_c8 = (rule<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(),_boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<boost::spirit::tag::char_code<boost::spirit::tag::space,_boost::spirit::char_encoding::ascii>_>,_0L>,_boost::spirit::unused_type,_boost::spirit::unused_type>
              *)local_90;
  boost::spirit::qi::
  rule<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>,std::__cxx11::string(),boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,boost::proto::argsns_::term<boost::spirit::tag::char_code<boost::spirit::tag::space,boost::spirit::char_encoding::ascii>>,0l>,boost::spirit::unused_type,boost::spirit::unused_type>
  ::
  define<mpl_::bool_<false>,boost::proto::exprns_::expr<boost::proto::tagns_::tag::shift_right,boost::proto::argsns_::list2<boost::proto::exprns_::expr<boost::proto::tagns_::tag::shift_right,boost::proto::argsns_::list2<boost::proto::exprns_::expr<boost::proto::tagns_::tag::shift_right,boost::proto::argsns_::list2<boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,boost::proto::argsns_::term<boost::spirit::terminal_ex<boost::spirit::tag::lit,boost::fusion::vector<char_const(&)[5]>>>,0l>const&,boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,boost::proto::argsns_::term<char_const&>,0l>>,2l>const&,boost::proto::exprns_::expr<boost::proto::tagns_::tag::subscript,boost::proto::argsns_::list2<boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,boost::proto::argsns_::term<boost::spirit::tag::lexeme>,0l>const&,boost::proto::exprns_::expr<boost::proto::tagns_::tag::unary_plus,boost::proto::argsns_::list1<boost::proto::exprns_::expr<boost::proto::tagns_::tag::subscript,boost::proto::argsns_::list2<boost::proto::exprns_::expr<boost::proto::tagns_::tag::minus,boost::proto::argsns_::list2<boost::spirit::terminal<boost::spirit::tag::char_code<boost::spirit::tag::char_,boost::spirit::char_encoding::ascii>>const&,boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,boost::proto::argsns_::term<char_const&>,0l>>,2l>const&,boost::phoenix::actor<boost::proto::exprns_::basic_expr<boost::proto::tagns_::tag::plus_assign,boost::proto::argsns_::list2<boost::phoenix::actor<boost::spirit::attribute<0>>,boost::phoenix::actor<boost::spirit::argument<0>>>,2l>>const&>,2l>const&>,1l>const&>,2l>const&>,2l>const&,boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,boost::proto::argsns_::term<char_const&>,0l>>,2l>>
            (local_b8._16_8_);
  prVar3 = local_68;
  local_120[0] = 0x3c;
  local_40 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
              **)CONCAT71(local_40._1_7_,0x2f);
  local_c8 = (rule<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(),_boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<boost::spirit::tag::char_code<boost::spirit::tag::space,_boost::spirit::char_encoding::ascii>_>,_0L>,_boost::spirit::unused_type,_boost::spirit::unused_type>
              *)local_120;
  local_15b[0] = '>';
  local_e8._0_8_ = &boost::spirit::ascii::char_;
  local_e8._8_8_ = local_15b;
  local_90._0_8_ = &boost::spirit::lexeme;
  local_90._8_8_ = &local_d8;
  local_159 = '>';
  unique0x00004e80 =
       (reference_wrapper<const_boost::spirit::qi::rule<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(),_boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<boost::spirit::tag::char_code<boost::spirit::tag::space,_boost::spirit::char_encoding::ascii>_>,_0L>,_boost::spirit::unused_type,_boost::spirit::unused_type>_>
        )&local_159;
  local_158._0_8_ =
       (rule<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_client::mini_xml_(),_boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<boost::spirit::tag::char_code<boost::spirit::tag::space,_boost::spirit::char_encoding::ascii>_>,_0L>,_boost::spirit::unused_type,_boost::spirit::unused_type>
        *)(local_108 + 0x10);
  local_108._0_8_ = (function_buffer *)local_e8;
  local_108._8_8_ = (long)local_120 + 0x10U;
  local_108._16_8_ = &local_c8;
  local_f0 = (function_buffer *)local_90;
  local_d8 = (function_buffer *)local_108;
  local_c0 = &local_b8;
  local_b8.members.obj_ptr = (function_buffer *)&local_40;
  boost::spirit::qi::
  rule<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>,std::__cxx11::string(),boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,boost::proto::argsns_::term<boost::spirit::tag::char_code<boost::spirit::tag::space,boost::spirit::char_encoding::ascii>>,0l>,boost::spirit::unused_type,boost::spirit::unused_type>
  ::
  define<mpl_::bool_<false>,boost::proto::exprns_::expr<boost::proto::tagns_::tag::shift_right,boost::proto::argsns_::list2<boost::proto::exprns_::expr<boost::proto::tagns_::tag::shift_right,boost::proto::argsns_::list2<boost::proto::exprns_::expr<boost::proto::tagns_::tag::shift_right,boost::proto::argsns_::list2<boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,boost::proto::argsns_::term<char_const&>,0l>,boost::proto::exprns_::expr<boost::proto::tagns_::tag::logical_not,boost::proto::argsns_::list1<boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,boost::proto::argsns_::term<boost::spirit::terminal_ex<boost::spirit::tag::lit,boost::fusion::vector<char>>>,0l>const&>,1l>const&>,2l>const&,boost::proto::exprns_::expr<boost::proto::tagns_::tag::subscript,boost::proto::argsns_::list2<boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,boost::proto::argsns_::term<boost::spirit::tag::lexeme>,0l>const&,boost::proto::exprns_::expr<boost::proto::tagns_::tag::unary_plus,boost::proto::argsns_::list1<boost::proto::exprns_::expr<boost::proto::tagns_::tag::subscript,boost::proto::argsns_::list2<boost::proto::exprns_::expr<boost::proto::tagns_::tag::minus,boost::proto::argsns_::list2<boost::spirit::terminal<boost::spirit::tag::char_code<boost::spirit::tag::char_,boost::spirit::char_encoding::ascii>>const&,boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,boost::proto::argsns_::term<char_const&>,0l>>,2l>const&,boost::phoenix::actor<boost::proto::exprns_::basic_expr<boost::proto::tagns_::tag::plus_assign,boost::proto::argsns_::list2<boost::phoenix::actor<boost::spirit::attribute<0>>,boost::phoenix::actor<boost::spirit::argument<0>>>,2l>>const&>,2l>const&>,1l>const&>,2l>const&>,2l>const&,boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,boost::proto::argsns_::term<char_const&>,0l>>,2l>>
            (local_68);
  local_158._0_8_ = "</";
  cStack_14d.ch = '>';
  boost::
  function<bool(__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>&,__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>const&,boost::spirit::context<boost::fusion::cons<boost::spirit::unused_type&,boost::fusion::cons<std::__cxx11::string,boost::fusion::nil_>>,boost::fusion::vector<>>&,boost::spirit::qi::char_class<boost::spirit::tag::char_code<boost::spirit::tag::space,boost::spirit::char_encoding::ascii>>const&)>
  ::operator=((function<bool(__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>&,__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>const&,boost::spirit::context<boost::fusion::cons<boost::spirit::unused_type&,boost::fusion::cons<std::__cxx11::string,boost::fusion::nil_>>,boost::fusion::vector<>>&,boost::spirit::qi::char_class<boost::spirit::tag::char_code<boost::spirit::tag::space,boost::spirit::char_encoding::ascii>>const&)>
               *)&(this->end_tag).f,
              (parser_binder<boost::spirit::qi::sequence<boost::fusion::cons<boost::spirit::qi::literal_string<const_char_(&)[3],_true>,_boost::fusion::cons<boost::spirit::qi::lazy_parser<boost::phoenix::actor<boost::proto::exprns_::basic_expr<boost::phoenix::detail::tag::function_eval,_boost::proto::argsns_::list2<boost::spirit::terminal<boost::spirit::tag::char_code<boost::spirit::tag::string,_boost::spirit::char_encoding::ascii>_>,_boost::phoenix::actor<boost::spirit::attribute<1>_>_>,_2L>_>,_boost::spirit::unused_type>,_boost::fusion::cons<boost::spirit::qi::literal_char<boost::spirit::char_encoding::standard,_true,_false>,_boost::fusion::nil_>_>_>_>,_mpl_::bool_<false>_>
               *)local_158);
  local_c8 = local_98;
  local_c0 = (function_buffer *)(local_120 + 0xf);
  local_b8.members.obj_ptr = local_a0;
  local_b8._8_8_ = local_120 + 0xe;
  local_e8._8_8_ = &local_b8;
  local_108._8_8_ = local_120;
  local_d8 = (function_buffer *)local_b8._16_8_;
  local_d0 = local_120 + 0xd;
  local_90._0_8_ = local_108;
  local_90._8_8_ = &local_d8;
  local_108._16_8_ = &local_c8;
  local_f0 = (function_buffer *)&local_40;
  unique0x00004e80 =
       (reference_wrapper<const_boost::spirit::qi::rule<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(),_boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<boost::spirit::tag::char_code<boost::spirit::tag::space,_boost::spirit::char_encoding::ascii>_>,_0L>,_boost::spirit::unused_type,_boost::spirit::unused_type>_>
        )local_15b;
  local_120[0x10] = 0x2e;
  local_120[0] = 0x2e;
  local_15b[0] = ';';
  local_158._0_8_ =
       (rule<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_client::mini_xml_(),_boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<boost::spirit::tag::char_code<boost::spirit::tag::space,_boost::spirit::char_encoding::ascii>_>,_0L>,_boost::spirit::unused_type,_boost::spirit::unused_type>
        *)(local_108 + 0x10);
  local_108._0_8_ = (function_buffer *)local_e8;
  local_e8._0_8_ = (long)local_120 + 0x10U;
  local_40 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
              **)local_90;
  boost::spirit::qi::
  rule<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>,std::__cxx11::string(),boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,boost::proto::argsns_::term<boost::spirit::tag::char_code<boost::spirit::tag::space,boost::spirit::char_encoding::ascii>>,0l>,boost::spirit::unused_type,boost::spirit::unused_type>
  ::
  define<mpl_::bool_<false>,boost::proto::exprns_::expr<boost::proto::tagns_::tag::shift_right,boost::proto::argsns_::list2<boost::proto::exprns_::expr<boost::proto::tagns_::tag::shift_right,boost::proto::argsns_::list2<boost::proto::exprns_::expr<boost::proto::tagns_::tag::subscript,boost::proto::argsns_::list2<boost::spirit::qi::rule<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>,std::__cxx11::string(),boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,boost::proto::argsns_::term<boost::spirit::tag::char_code<boost::spirit::tag::space,boost::spirit::char_encoding::ascii>>,0l>,boost::spirit::unused_type,boost::spirit::unused_type>&,boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,boost::proto::argsns_::term<client::mini_xml_grammar<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>::mini_xml_grammar()::_lambda(std::__cxx11::string_const&)_1_&>,0l>>,2l>const&,boost::proto::exprns_::expr<boost::proto::tagns_::tag::dereference,boost:___exprns_::expr<boost::proto::tagns_::tag::terminal,boost::proto::argsns_::term<char_const&>,0l>>,2l>>
            (local_90._24_8_);
  local_148.child0.ref.t_ =
       (proto_child0)
       (local_60->
       super_extends<boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<boost::spirit::qi::reference<const_boost::spirit::qi::rule<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_boost::variant<boost::recursive_wrapper<client::mini_xml>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_(),_boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<boost::spirit::tag::char_code<boost::spirit::tag::space,_boost::spirit::char_encoding::ascii>_>,_0L>,_boost::spirit::unused_type,_boost::spirit::unused_type>_>_>,_0L>,_boost::spirit::qi::rule<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_boost::variant<boost::recursive_wrapper<client::mini_xml>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_(),_boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<boost::spirit::tag::char_code<boost::spirit::tag::space,_boost::spirit::char_encoding::ascii>_>,_0L>,_boost::spirit::unused_type,_boost::spirit::unused_type>,_boost::proto::domainns_::default_domain,_0L>
       ).proto_expr_.child0.ref.t_;
  local_158._0_8_ =
       (prVar3->
       super_extends<boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<boost::spirit::qi::reference<const_boost::spirit::qi::rule<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(),_boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<boost::spirit::tag::char_code<boost::spirit::tag::space,_boost::spirit::char_encoding::ascii>_>,_0L>,_boost::spirit::unused_type,_boost::spirit::unused_type>_>_>,_0L>,_boost::spirit::qi::rule<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(),_boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<boost::spirit::tag::char_code<boost::spirit::tag::space,_boost::spirit::char_encoding::ascii>_>,_0L>,_boost::spirit::unused_type,_boost::spirit::unused_type>,_boost::proto::domainns_::default_domain,_0L>
       ).proto_expr_.child0.ref.t_;
  local_138.t_ = local_70;
  boost::
  function<bool_(__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_&,_const___gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_&,_boost::spirit::context<boost::fusion::cons<client::mini_xml_&,_boost::fusion::nil_>,_boost::fusion::vector<>_>_&,_const_boost::spirit::qi::char_class<boost::spirit::tag::char_code<boost::spirit::tag::space,_boost::spirit::char_encoding::ascii>_>_&)>
  ::operator=<_e88e36b_>(&(this->xml).f,(parser_binder<_f7069952_> *)local_158);
  return;
}

Assistant:

mini_xml_grammar() : mini_xml_grammar::base_type(xml)
        {
            using qi::lit;
            using qi::lexeme;
            using ascii::char_;
            using ascii::string;
            using namespace qi::labels;

            using phoenix::at_c;
            using phoenix::push_back;

            auto transitions_from_print = [](const std::string& s) {std::cout << "transitions_from: '" << s  << "'" << std::endl; };
            auto switch_to_print = [](const std::string& s) {std::cout << "switch_to: '" << s  << "'" << std::endl; };
            auto when_print = [](const std::string& s) {std::cout << "when: '" << s  << "'" << std::endl; };

            text = lexeme[+(char_ - '<')        [_val += _1]];
            node = (xml | text)                 [_val = _1];

            transitions_from =
                *(char_ - 't')
                >> lit("transitions_from")
                >> '('
                >> lexeme[+(char_ - ')')       [_val += _1]]
                >> ')'
            ;

            switch_to =
                   lit("switch_to")
                >> '('
                >> lexeme[+(char_ - ')')       [_val += _1]]
                >> ')'
            ;

            when =
                   lit("when")
                >> '('
                >> lexeme[+(char_ - ')')       [_val += _1]]
                >> ')'
            ;

            start_tag =
                    '<'
                >>  !lit('/')
                >>  lexeme[+(char_ - '>')       [_val += _1]]
                >>  '>'
            ;

            end_tag =
                    "</"
                >>  string(_r1)
                >>  '>'
            ;

            transitions_declaration =
                    transitions_from[transitions_from_print]
                >>  *( '.' >> switch_to[switch_to_print] >> '.' >> when[when_print])
                >>  ';'
            ;

//            xml =
//                    transitions_declaration
//                    >> '}'


            xml =
                start_tag                 [at_c<0>(_val) = _1]
                >>  *node                 [push_back(at_c<1>(_val), _1)]
                >>  end_tag(at_c<0>(_val))
            ;
//            xml =
//                    start_tag                   [at_c<0>(_val) = _1]
//                >>  *node                       [push_back(at_c<1>(_val), _1)]
//                >>  end_tag(at_c<0>(_val))
//            ;
        }